

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb-c.cpp
# Opt level: O3

duckdb_query_progress_type *
duckdb_query_progress
          (duckdb_query_progress_type *__return_storage_ptr__,duckdb_connection connection)

{
  double dVar1;
  ClientContext *this;
  uint64_t uVar2;
  QueryProgress query_progress;
  QueryProgress QStack_28;
  
  __return_storage_ptr__->percentage = -1.0;
  __return_storage_ptr__->rows_processed = 0;
  __return_storage_ptr__->total_rows_to_process = 0;
  if (connection != (duckdb_connection)0x0) {
    this = duckdb::shared_ptr<duckdb::ClientContext,_true>::operator->
                     ((shared_ptr<duckdb::ClientContext,_true> *)connection);
    duckdb::ClientContext::GetQueryProgress(&QStack_28,this);
    uVar2 = duckdb::QueryProgress::GetTotalRowsToProcess(&QStack_28);
    __return_storage_ptr__->total_rows_to_process = uVar2;
    uVar2 = duckdb::QueryProgress::GetRowsProcesseed(&QStack_28);
    __return_storage_ptr__->rows_processed = uVar2;
    dVar1 = duckdb::QueryProgress::GetPercentage(&QStack_28);
    __return_storage_ptr__->percentage = dVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

duckdb_query_progress_type duckdb_query_progress(duckdb_connection connection) {
	duckdb_query_progress_type query_progress_type;
	query_progress_type.percentage = -1;
	query_progress_type.total_rows_to_process = 0;
	query_progress_type.rows_processed = 0;
	if (!connection) {
		return query_progress_type;
	}
	Connection *conn = reinterpret_cast<Connection *>(connection);
	auto query_progress = conn->context->GetQueryProgress();
	query_progress_type.total_rows_to_process = query_progress.GetTotalRowsToProcess();
	query_progress_type.rows_processed = query_progress.GetRowsProcesseed();
	query_progress_type.percentage = query_progress.GetPercentage();
	return query_progress_type;
}